

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O1

void __thiscall Lib::List<Kernel::Unit_*>::DelIterator::del(DelIterator *this)

{
  List<Kernel::Unit_*> *pLVar1;
  void **head;
  List<Kernel::Unit_*> *pLVar2;
  
  pLVar2 = this->_cur;
  pLVar1 = *this->_lst;
  if (pLVar2 == pLVar1) {
    *this->_lst = pLVar1->_tail;
    pLVar2 = this->_cur;
    if (pLVar2 != (List<Kernel::Unit_*> *)0x0) {
      pLVar2->_head = (Unit *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pLVar2;
    }
    pLVar2 = (List<Kernel::Unit_*> *)0x0;
  }
  else {
    this->_prev->_tail = pLVar2->_tail;
    if (pLVar2 != (List<Kernel::Unit_*> *)0x0) {
      pLVar2->_head = (Unit *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pLVar2;
    }
    pLVar2 = this->_prev;
  }
  this->_cur = pLVar2;
  return;
}

Assistant:

void del()
    {
      // we can only delete the element returned by next
      ASS_NEQ(_cur,0);
      // check that two delete requests in row did not occur
      ASS_NEQ(_cur,_prev);

      if (_cur == _lst) { // the first element must be deleted
	_lst = _lst->tail();
	delete _cur;
	_cur = 0;
	return;
      }

      ASS_NEQ(_prev,0);
      // not the first element
      _prev->setTail(_cur->tail());
      delete _cur;
      _cur = _prev;
    }